

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_stats.cpp
# Opt level: O2

void duckdb::StructStats::Deserialize(Deserializer *deserializer,BaseStatistics *base)

{
  int iVar1;
  child_list_t<LogicalType> *this;
  undefined4 extraout_var;
  const_reference pvVar2;
  long lVar3;
  size_type __n;
  type local_88;
  
  this = StructType::GetChildTypes_abi_cxx11_(&base->type);
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"child_stats");
  iVar1 = (*deserializer->_vptr_Deserializer[8])(deserializer);
  lVar3 = 0;
  for (__n = 0; CONCAT44(extraout_var,iVar1) != __n; __n = __n + 1) {
    pvVar2 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
             ::get<true>(this,__n);
    ::std::
    deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
    ::emplace_back<duckdb::LogicalType_const&>
              ((deque<std::reference_wrapper<duckdb::LogicalType_const>,std::allocator<std::reference_wrapper<duckdb::LogicalType_const>>>
                *)&(deserializer->data).types,&pvVar2->second);
    Deserializer::Read<duckdb::BaseStatistics>(&local_88,deserializer);
    BaseStatistics::Copy
              ((BaseStatistics *)
               (&(((base->child_stats).
                   super_unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>
                   .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl)->type).id_
               + lVar3),&local_88);
    SerializationData::Unset<duckdb::LogicalType>(&deserializer->data);
    BaseStatistics::~BaseStatistics(&local_88);
    lVar3 = lVar3 + 0x58;
  }
  (*deserializer->_vptr_Deserializer[9])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  return;
}

Assistant:

void StructStats::Deserialize(Deserializer &deserializer, BaseStatistics &base) {
	auto &type = base.GetType();
	D_ASSERT(type.InternalType() == PhysicalType::STRUCT);

	auto &child_types = StructType::GetChildTypes(type);

	deserializer.ReadList(200, "child_stats", [&](Deserializer::List &list, idx_t i) {
		deserializer.Set<const LogicalType &>(child_types[i].second);
		auto stat = list.ReadElement<BaseStatistics>();
		base.child_stats[i].Copy(stat);
		deserializer.Unset<LogicalType>();
	});
}